

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APInt::sdiv(APInt *this,int64_t RHS)

{
  anon_union_8_2_1313ab2f_for_U aVar1;
  uint uVar2;
  bool bVar3;
  long in_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  ulong uVar5;
  APInt AVar6;
  anon_union_8_2_1313ab2f_for_U local_78;
  uint local_70;
  anon_union_8_2_1313ab2f_for_U local_68;
  uint local_60;
  anon_union_8_2_1313ab2f_for_U local_58;
  uint local_50;
  anon_union_8_2_1313ab2f_for_U local_48;
  uint local_40;
  anon_union_8_2_1313ab2f_for_U local_38;
  uint local_30;
  
  bVar3 = operator[]((APInt *)RHS,*(int *)(RHS + 8) - 1);
  if (bVar3) {
    if (in_RDX < 0) {
      local_60 = *(uint *)(RHS + 8);
      if ((ulong)local_60 < 0x41) {
        local_68 = *(anon_union_8_2_1313ab2f_for_U *)RHS;
      }
      else {
        uVar5 = (ulong)((uint)((ulong)local_60 + 0x3f >> 3) & 0xfffffff8);
        local_68.pVal = (uint64_t *)operator_new__(uVar5);
        memcpy(local_68.pVal,*(void **)RHS,uVar5);
      }
      flipAllBits((APInt *)&local_68);
      operator++((APInt *)&local_68);
      local_50 = local_60;
      local_58.VAL = local_68.VAL;
      local_60 = 0;
      AVar6 = udiv(this,(uint64_t)&local_58);
      uVar4 = AVar6._8_8_;
      aVar1 = local_68;
      uVar2 = local_60;
      if ((0x40 < local_50) && ((void *)local_58.VAL != (void *)0x0)) {
        operator_delete__(local_58.pVal);
        uVar4 = extraout_RDX_02;
        aVar1 = local_68;
        uVar2 = local_60;
      }
    }
    else {
      local_70 = *(uint *)(RHS + 8);
      if ((ulong)local_70 < 0x41) {
        local_78 = *(anon_union_8_2_1313ab2f_for_U *)RHS;
      }
      else {
        uVar5 = (ulong)((uint)((ulong)local_70 + 0x3f >> 3) & 0xfffffff8);
        local_78.pVal = (uint64_t *)operator_new__(uVar5);
        memcpy(local_78.pVal,*(void **)RHS,uVar5);
      }
      flipAllBits((APInt *)&local_78);
      operator++((APInt *)&local_78);
      local_50 = local_70;
      local_58 = local_78;
      local_70 = 0;
      udiv((APInt *)&local_38,(uint64_t)&local_58);
      flipAllBits((APInt *)&local_38);
      operator++((APInt *)&local_38);
      this->BitWidth = local_30;
      this->U = local_38;
      local_30 = 0;
      uVar4 = extraout_RDX_00;
      aVar1 = local_78;
      uVar2 = local_70;
      if ((0x40 < local_50) && ((void *)local_58.VAL != (void *)0x0)) {
        operator_delete__(local_58.pVal);
        uVar4 = extraout_RDX_01;
        aVar1 = local_78;
        uVar2 = local_70;
      }
    }
    if ((0x40 < uVar2) && ((void *)aVar1.VAL != (void *)0x0)) {
      operator_delete__(aVar1.pVal);
      uVar4 = extraout_RDX_03;
    }
  }
  else if (in_RDX < 0) {
    udiv((APInt *)&local_48,RHS);
    flipAllBits((APInt *)&local_48);
    operator++((APInt *)&local_48);
    this->BitWidth = local_40;
    this->U = local_48;
    uVar4 = extraout_RDX;
  }
  else {
    AVar6 = udiv(this,RHS);
    uVar4 = AVar6._8_8_;
  }
  AVar6._8_8_ = uVar4;
  AVar6.U.pVal = (uint64_t *)this;
  return AVar6;
}

Assistant:

APInt APInt::sdiv(int64_t RHS) const {
  if (isNegative()) {
    if (RHS < 0)
      return (-(*this)).udiv(-RHS);
    return -((-(*this)).udiv(RHS));
  }
  if (RHS < 0)
    return -(this->udiv(-RHS));
  return this->udiv(RHS);
}